

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void action_wiresnips(tgestate_t *state)

{
  byte bVar1;
  tgestate_t *in_RDI;
  uint8_t coord_1;
  uint8_t coord;
  uint8_t flag;
  uint8_t iters;
  mappos8_t *mappos;
  wall_t *wall;
  uint8_t local_1a;
  char local_19;
  wall_t *local_10;
  
  local_10 = (wall_t *)0x1191d8;
  local_19 = '\x04';
  do {
    bVar1 = (in_RDI->hero_mappos).v;
    if ((*(byte *)((long)local_10 + 2) <= bVar1) && (bVar1 < *(byte *)((long)local_10 + 3))) {
      bVar1 = (in_RDI->hero_mappos).u;
      if (bVar1 == *(byte *)((long)local_10 + 1)) {
        local_1a = '\x04';
        goto LAB_001081c7;
      }
      if (bVar1 - 1 == (uint)*(byte *)((long)local_10 + 1)) {
        local_1a = '\x06';
        goto LAB_001081c7;
      }
    }
    local_10 = (wall_t *)((long)local_10 + 6);
    local_19 = local_19 + -1;
  } while (local_19 != '\0');
  local_10 = walls + 0x10;
  local_19 = '\x03';
  do {
    bVar1 = (in_RDI->hero_mappos).u;
    if ((local_10->minx <= bVar1) && (bVar1 < local_10->maxx)) {
      bVar1 = (in_RDI->hero_mappos).v;
      if (bVar1 == local_10->miny) {
        local_1a = '\x05';
LAB_001081c7:
        in_RDI->vischars[0].direction = local_1a;
        in_RDI->vischars[0].input = 0x80;
        in_RDI->vischars[0].flags = '\x02';
        in_RDI->vischars[0].mi.mappos.w = 0xc;
        in_RDI->vischars[0].mi.sprite = sprites + 2;
        in_RDI->player_locked_out_until = in_RDI->game_counter + '`';
        queue_message(in_RDI,message_CUTTING_THE_WIRE);
        return;
      }
      if (bVar1 - 1 == (uint)local_10->miny) {
        local_1a = '\a';
        goto LAB_001081c7;
      }
    }
    local_10 = local_10 + 1;
    local_19 = local_19 + -1;
    if (local_19 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

void action_wiresnips(tgestate_t *state)
{
  const wall_t    *wall;   /* was HL */
  const mappos8_t *mappos; /* was DE */
  uint8_t          iters;  /* was B */
  uint8_t          flag;   /* was A */

  assert(state != NULL);

  wall = &walls[12]; /* start of (vertical) fences */
  mappos = &state->hero_mappos;
  iters = 4;
  do
  {
    uint8_t coord; /* was A */

    // check: this is using x then y which is the wrong order, isn't it?
    coord = mappos->v;
    if (coord >= wall->miny && coord < wall->maxy) /* Conv: Reversed test order. */
    {
      coord = mappos->u;
      if (coord == wall->maxx)
        goto snips_crawl_tl;
      if (coord - 1 == wall->maxx)
        goto snips_crawl_br;
    }

    wall++;
  }
  while (--iters);

  wall = &walls[12 + 4]; /* start of (horizontal) fences */
  mappos = &state->hero_mappos;
  iters = 3;
  do
  {
    uint8_t coord; /* was A */

    coord = mappos->u;
    if (coord >= wall->minx && coord < wall->maxx)
    {
      coord = mappos->v;
      if (coord == wall->miny)
        goto snips_crawl_tr;
      if (coord - 1 == wall->miny)
        goto snips_crawl_bl;
    }

    wall++;
  }
  while (--iters);

  return;

snips_crawl_tl: /* Crawl TL */
  flag = direction_TOP_LEFT | vischar_DIRECTION_CRAWL;
  goto action_wiresnips_tail;

snips_crawl_tr: /* Crawl TR */
  flag = direction_TOP_RIGHT | vischar_DIRECTION_CRAWL;
  goto action_wiresnips_tail;

snips_crawl_br: /* Crawl BR */
  flag = direction_BOTTOM_RIGHT | vischar_DIRECTION_CRAWL;
  goto action_wiresnips_tail;

snips_crawl_bl: /* Crawl BL */
  flag = direction_BOTTOM_LEFT | vischar_DIRECTION_CRAWL;

action_wiresnips_tail:
  state->vischars[0].direction   = flag; // dir + walk/crawl flag
  state->vischars[0].input       = input_KICK;
  state->vischars[0].flags       = vischar_FLAGS_CUTTING_WIRE;
  state->vischars[0].mi.mappos.w = 12; // crawling height
  state->vischars[0].mi.sprite   = &sprites[sprite_PRISONER_FACING_AWAY_1];
  state->player_locked_out_until = state->game_counter + 96;
  queue_message(state, message_CUTTING_THE_WIRE);
}